

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O3

bool __thiscall
basisu::tree_vector_quant<basisu::vec<16U,_float>_>::refine_split
          (tree_vector_quant<basisu::vec<16U,_float>_> *this,tsvq_node *node,
          vec<16U,_float> *l_child,uint64_t *l_weight,float *l_var,vector<unsigned_int> *l_children,
          vec<16U,_float> *r_child,uint64_t *r_weight,float *r_var,vector<unsigned_int> *r_children)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  pair<basisu::vec<16U,_float>,_unsigned_long> *ppVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  ulong uVar9;
  pair<basisu::vec<16U,_float>,_unsigned_long> *ppVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint32_t i_7;
  uint *puVar16;
  ulong uVar17;
  int iVar18;
  uint32_t *puVar19;
  char *__function;
  long lVar20;
  uint *puVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  double d2;
  float fVar27;
  float fVar28;
  double d2_1;
  float fVar29;
  vec<16U,_float> new_r_child;
  vec<16U,_float> new_l_child;
  vec<16U,_float> res;
  vec<16U,_float> res_2;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float afStack_70 [16];
  
  vector<unsigned_int>::reserve(l_children,(ulong)(node->m_training_vecs).m_size);
  vector<unsigned_int>::reserve(r_children,(ulong)(node->m_training_vecs).m_size);
  puVar1 = &l_children->m_size;
  puVar2 = &r_children->m_size;
  iVar18 = 0;
  fVar25 = 1e+10;
  do {
    if (*puVar1 != 0) {
      *puVar1 = 0;
    }
    if (*puVar2 != 0) {
      *puVar2 = 0;
    }
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_138 = 0;
    uStack_130 = 0;
    *l_weight = 0;
    *r_weight = 0;
    if ((node->m_training_vecs).m_size == 0) {
LAB_002429e7:
      if (*puVar1 != 0) {
        *puVar1 = 0;
      }
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      *l_weight = 0;
      if (*puVar2 != 0) {
        *puVar2 = 0;
      }
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128 = 0;
      uStack_120 = 0;
      local_138 = 0;
      uStack_130 = 0;
      *r_weight = 0;
      if ((node->m_training_vecs).m_size == 0) {
        return false;
      }
      uVar17 = 0;
      fVar26 = 0.0;
      fVar15 = 0.0;
      do {
        uVar23 = (node->m_training_vecs).m_p[uVar17];
        if ((this->m_training_vecs).m_size <= uVar23) goto LAB_00243075;
        ppVar10 = (this->m_training_vecs).m_p;
        ppVar4 = ppVar10 + uVar23;
        uVar9 = ppVar4->second;
        uVar24 = (uint)uVar17;
        if (uVar17 == 0) {
LAB_00242afc:
          local_88 = *(undefined8 *)((ppVar4->first).m_v + 0xc);
          uStack_80 = *(undefined8 *)((ppVar4->first).m_v + 0xe);
          local_98 = *(undefined8 *)((ppVar4->first).m_v + 8);
          uStack_90 = *(undefined8 *)((ppVar4->first).m_v + 10);
          local_a8 = *(undefined8 *)((ppVar4->first).m_v + 4);
          uStack_a0 = *(undefined8 *)((ppVar4->first).m_v + 6);
          local_b8 = *(undefined8 *)(ppVar4->first).m_v;
          uStack_b0 = *(undefined8 *)((ppVar4->first).m_v + 2);
          fVar27 = (float)uVar9;
          lVar20 = 0;
          do {
            pfVar8 = (ppVar4->first).m_v + lVar20;
            fVar28 = pfVar8[1];
            fVar29 = pfVar8[2];
            fVar11 = pfVar8[3];
            afStack_70[lVar20] = *pfVar8 * fVar27;
            afStack_70[lVar20 + 1] = fVar28 * fVar27;
            afStack_70[lVar20 + 2] = fVar29 * fVar27;
            afStack_70[lVar20 + 3] = fVar11 * fVar27;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
          lVar20 = 0;
          do {
            fVar28 = afStack_70[lVar20 + 1];
            fVar29 = afStack_70[lVar20 + 2];
            fVar11 = afStack_70[lVar20 + 3];
            lVar5 = lVar20 * 4;
            fVar12 = *(float *)((long)&local_138 + lVar5 + 4);
            fVar13 = *(float *)((long)&uStack_130 + lVar5);
            fVar14 = *(float *)((long)&uStack_130 + lVar5 + 4);
            lVar6 = lVar20 * 4;
            *(float *)((long)&local_138 + lVar6) =
                 *(float *)((long)&local_138 + lVar5) + afStack_70[lVar20];
            *(float *)((long)&local_138 + lVar6 + 4) = fVar12 + fVar28;
            *(float *)((long)&uStack_130 + lVar6) = fVar13 + fVar29;
            *(float *)((long)&uStack_130 + lVar6 + 4) = fVar14 + fVar11;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
          *r_weight = *r_weight + uVar9;
          fVar28 = (ppVar4->first).m_v[0];
          fVar28 = fVar28 * fVar28;
          lVar20 = 1;
          do {
            fVar29 = (ppVar4->first).m_v[lVar20];
            fVar28 = fVar28 + fVar29 * fVar29;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x10);
          if ((node->m_training_vecs).m_size <= uVar24) goto LAB_0024308c;
          puVar21 = (node->m_training_vecs).m_p + uVar17;
          puVar16 = r_children->m_p;
          uVar23 = r_children->m_size;
          uVar17 = (ulong)uVar23;
          if (puVar21 < puVar16 + uVar17 && (puVar16 <= puVar21 && puVar16 != (uint *)0x0)) {
LAB_002430ab:
            __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x267,
                          "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]"
                         );
          }
          if (r_children->m_capacity <= uVar23) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)r_children,uVar23 + 1,true,4,(object_mover)0x0,false);
            puVar16 = r_children->m_p;
            uVar17 = (ulong)r_children->m_size;
          }
          fVar15 = fVar15 + fVar28 * fVar27;
          puVar16 = puVar16 + uVar17;
          puVar19 = puVar2;
        }
        else {
          fVar27 = (ppVar4->first).m_v[0];
          if ((fVar27 == (float)local_b8) && (!NAN(fVar27) && !NAN((float)local_b8))) {
            uVar22 = 0xffffffffffffffff;
            do {
              if (uVar22 == 0xe) goto LAB_00242afc;
              fVar27 = ppVar10[uVar23].first.m_v[uVar22 + 2];
              uVar3 = uVar22 + 1;
              pfVar8 = (float *)((long)&uStack_b0 + uVar22 * 4);
            } while ((fVar27 == *pfVar8) && (uVar22 = uVar3, !NAN(fVar27) && !NAN(*pfVar8)));
            if (0xe < uVar3) goto LAB_00242afc;
          }
          fVar27 = (float)uVar9;
          lVar20 = 0;
          do {
            pfVar8 = (ppVar4->first).m_v + lVar20;
            fVar28 = pfVar8[1];
            fVar29 = pfVar8[2];
            fVar11 = pfVar8[3];
            afStack_70[lVar20] = *pfVar8 * fVar27;
            afStack_70[lVar20 + 1] = fVar28 * fVar27;
            afStack_70[lVar20 + 2] = fVar29 * fVar27;
            afStack_70[lVar20 + 3] = fVar11 * fVar27;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
          lVar20 = 0;
          do {
            fVar28 = afStack_70[lVar20 + 1];
            fVar29 = afStack_70[lVar20 + 2];
            fVar11 = afStack_70[lVar20 + 3];
            lVar5 = lVar20 * 4;
            fVar12 = *(float *)((long)&local_f8 + lVar5 + 4);
            fVar13 = *(float *)((long)&uStack_f0 + lVar5);
            fVar14 = *(float *)((long)&uStack_f0 + lVar5 + 4);
            lVar6 = lVar20 * 4;
            *(float *)((long)&local_f8 + lVar6) =
                 *(float *)((long)&local_f8 + lVar5) + afStack_70[lVar20];
            *(float *)((long)&local_f8 + lVar6 + 4) = fVar12 + fVar28;
            *(float *)((long)&uStack_f0 + lVar6) = fVar13 + fVar29;
            *(float *)((long)&uStack_f0 + lVar6 + 4) = fVar14 + fVar11;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
          *l_weight = *l_weight + uVar9;
          fVar28 = (ppVar4->first).m_v[0];
          fVar28 = fVar28 * fVar28;
          lVar20 = 1;
          do {
            fVar29 = (ppVar4->first).m_v[lVar20];
            fVar28 = fVar28 + fVar29 * fVar29;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x10);
          if ((node->m_training_vecs).m_size <= uVar24) goto LAB_0024308c;
          puVar21 = (node->m_training_vecs).m_p + uVar17;
          puVar16 = l_children->m_p;
          uVar23 = l_children->m_size;
          uVar17 = (ulong)uVar23;
          if (puVar21 < puVar16 + uVar17 && (puVar16 <= puVar21 && puVar16 != (uint *)0x0))
          goto LAB_002430ab;
          if (l_children->m_capacity <= uVar23) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)l_children,uVar23 + 1,true,4,(object_mover)0x0,false);
            puVar16 = l_children->m_p;
            uVar17 = (ulong)l_children->m_size;
          }
          fVar26 = fVar26 + fVar28 * fVar27;
          puVar16 = puVar16 + uVar17;
          puVar19 = puVar1;
        }
        *puVar16 = *puVar21;
        *puVar19 = *puVar19 + 1;
        uVar17 = (ulong)(uVar24 + 1);
      } while (uVar24 + 1 < (node->m_training_vecs).m_size);
      uVar17 = *l_weight;
      if (uVar17 == 0) {
        return false;
      }
      if (*r_weight == 0) {
        return false;
      }
    }
    else {
      uVar17 = 0;
      fVar26 = 0.0;
      fVar15 = 0.0;
      do {
        uVar23 = (node->m_training_vecs).m_p[uVar17];
        if ((this->m_training_vecs).m_size <= uVar23) goto LAB_00243075;
        ppVar4 = (this->m_training_vecs).m_p + uVar23;
        uVar9 = ppVar4->second;
        fVar27 = 0.0;
        lVar20 = 0;
        do {
          fVar28 = l_child->m_v[lVar20] - (ppVar4->first).m_v[lVar20];
          fVar27 = fVar27 + fVar28 * fVar28;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
        fVar28 = 0.0;
        lVar20 = 0;
        do {
          fVar29 = r_child->m_v[lVar20] - (ppVar4->first).m_v[lVar20];
          fVar28 = fVar28 + fVar29 * fVar29;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
        fVar29 = (float)uVar9;
        uVar23 = (uint)uVar17;
        if (fVar28 <= fVar27) {
          lVar20 = 0;
          do {
            pfVar8 = (ppVar4->first).m_v + lVar20;
            fVar27 = pfVar8[1];
            fVar28 = pfVar8[2];
            fVar11 = pfVar8[3];
            lVar5 = lVar20 * 4;
            *(float *)((long)&local_b8 + lVar5) = *pfVar8 * fVar29;
            *(float *)((long)&local_b8 + lVar5 + 4) = fVar27 * fVar29;
            *(float *)((long)&uStack_b0 + lVar5) = fVar28 * fVar29;
            *(float *)((long)&uStack_b0 + lVar5 + 4) = fVar11 * fVar29;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
          lVar20 = 0;
          do {
            lVar7 = lVar20 * 4;
            fVar27 = *(float *)((long)&local_b8 + lVar7 + 4);
            fVar28 = *(float *)((long)&uStack_b0 + lVar7);
            fVar11 = *(float *)((long)&uStack_b0 + lVar7 + 4);
            lVar5 = lVar20 * 4;
            fVar12 = *(float *)((long)&local_138 + lVar5 + 4);
            fVar13 = *(float *)((long)&uStack_130 + lVar5);
            fVar14 = *(float *)((long)&uStack_130 + lVar5 + 4);
            lVar6 = lVar20 * 4;
            *(float *)((long)&local_138 + lVar6) =
                 *(float *)((long)&local_138 + lVar5) + *(float *)((long)&local_b8 + lVar7);
            *(float *)((long)&local_138 + lVar6 + 4) = fVar12 + fVar27;
            *(float *)((long)&uStack_130 + lVar6) = fVar13 + fVar28;
            *(float *)((long)&uStack_130 + lVar6 + 4) = fVar14 + fVar11;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
          *r_weight = *r_weight + uVar9;
          fVar27 = (ppVar4->first).m_v[0];
          fVar27 = fVar27 * fVar27;
          lVar20 = 1;
          do {
            fVar28 = (ppVar4->first).m_v[lVar20];
            fVar27 = fVar27 + fVar28 * fVar28;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x10);
          if ((node->m_training_vecs).m_size <= uVar23) goto LAB_0024308c;
          puVar21 = (node->m_training_vecs).m_p + uVar17;
          puVar16 = r_children->m_p;
          uVar24 = r_children->m_size;
          uVar17 = (ulong)uVar24;
          if (puVar21 < puVar16 + uVar17 && (puVar16 <= puVar21 && puVar16 != (uint *)0x0))
          goto LAB_002430ab;
          if (r_children->m_capacity <= uVar24) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)r_children,uVar24 + 1,true,4,(object_mover)0x0,false);
            puVar16 = r_children->m_p;
            uVar17 = (ulong)r_children->m_size;
          }
          fVar15 = fVar15 + fVar27 * fVar29;
          puVar16 = puVar16 + uVar17;
          puVar19 = puVar2;
        }
        else {
          lVar20 = 0;
          do {
            pfVar8 = (ppVar4->first).m_v + lVar20;
            fVar27 = pfVar8[1];
            fVar28 = pfVar8[2];
            fVar11 = pfVar8[3];
            lVar5 = lVar20 * 4;
            *(float *)((long)&local_b8 + lVar5) = *pfVar8 * fVar29;
            *(float *)((long)&local_b8 + lVar5 + 4) = fVar27 * fVar29;
            *(float *)((long)&uStack_b0 + lVar5) = fVar28 * fVar29;
            *(float *)((long)&uStack_b0 + lVar5 + 4) = fVar11 * fVar29;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
          lVar20 = 0;
          do {
            lVar5 = lVar20 * 4;
            fVar27 = *(float *)((long)&local_b8 + lVar5 + 4);
            fVar28 = *(float *)((long)&uStack_b0 + lVar5);
            fVar11 = *(float *)((long)&uStack_b0 + lVar5 + 4);
            lVar6 = lVar20 * 4;
            fVar12 = *(float *)((long)&local_f8 + lVar6 + 4);
            fVar13 = *(float *)((long)&uStack_f0 + lVar6);
            fVar14 = *(float *)((long)&uStack_f0 + lVar6 + 4);
            lVar7 = lVar20 * 4;
            *(float *)((long)&local_f8 + lVar7) =
                 *(float *)((long)&local_f8 + lVar6) + *(float *)((long)&local_b8 + lVar5);
            *(float *)((long)&local_f8 + lVar7 + 4) = fVar12 + fVar27;
            *(float *)((long)&uStack_f0 + lVar7) = fVar13 + fVar28;
            *(float *)((long)&uStack_f0 + lVar7 + 4) = fVar14 + fVar11;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
          *l_weight = *l_weight + uVar9;
          fVar27 = (ppVar4->first).m_v[0];
          fVar27 = fVar27 * fVar27;
          lVar20 = 1;
          do {
            fVar28 = (ppVar4->first).m_v[lVar20];
            fVar27 = fVar27 + fVar28 * fVar28;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x10);
          if ((node->m_training_vecs).m_size <= uVar23) goto LAB_0024308c;
          puVar21 = (node->m_training_vecs).m_p + uVar17;
          puVar16 = l_children->m_p;
          uVar24 = l_children->m_size;
          uVar17 = (ulong)uVar24;
          if (puVar21 < puVar16 + uVar17 && (puVar16 <= puVar21 && puVar16 != (uint *)0x0))
          goto LAB_002430ab;
          if (l_children->m_capacity <= uVar24) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)l_children,uVar24 + 1,true,4,(object_mover)0x0,false);
            puVar16 = l_children->m_p;
            uVar17 = (ulong)l_children->m_size;
          }
          fVar26 = fVar26 + fVar27 * fVar29;
          puVar16 = puVar16 + uVar17;
          puVar19 = puVar1;
        }
        *puVar16 = *puVar21;
        *puVar19 = *puVar19 + 1;
        uVar17 = (ulong)(uVar23 + 1);
      } while (uVar23 + 1 < (node->m_training_vecs).m_size);
      uVar17 = *l_weight;
      if ((uVar17 == 0) || (*r_weight == 0)) goto LAB_002429e7;
    }
    fVar27 = (float)local_f8 * (float)local_f8;
    lVar20 = 1;
    do {
      fVar28 = *(float *)((long)&local_f8 + lVar20 * 4);
      fVar27 = fVar27 + fVar28 * fVar28;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x10);
    *l_var = fVar26 - fVar27 / (float)uVar17;
    fVar26 = (float)local_138 * (float)local_138;
    lVar20 = 1;
    do {
      fVar27 = *(float *)((long)&local_138 + lVar20 * 4);
      fVar26 = fVar26 + fVar27 * fVar27;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x10);
    *r_var = fVar15 - fVar26 / (float)*r_weight;
    fVar26 = 1.0 / (float)*l_weight;
    lVar20 = 0;
    do {
      lVar5 = lVar20 * 4;
      fVar15 = *(float *)((long)&local_f8 + lVar5 + 4);
      fVar27 = *(float *)((long)&uStack_f0 + lVar5);
      fVar28 = *(float *)((long)&uStack_f0 + lVar5 + 4);
      lVar6 = lVar20 * 4;
      *(float *)((long)&local_f8 + lVar6) = *(float *)((long)&local_f8 + lVar5) * fVar26;
      *(float *)((long)&local_f8 + lVar6 + 4) = fVar15 * fVar26;
      *(float *)((long)&uStack_f0 + lVar6) = fVar27 * fVar26;
      *(float *)((long)&uStack_f0 + lVar6 + 4) = fVar28 * fVar26;
      lVar20 = lVar20 + 4;
    } while (lVar20 != 0x10);
    fVar26 = 1.0 / (float)*r_weight;
    lVar20 = 0;
    do {
      lVar5 = lVar20 * 4;
      fVar15 = *(float *)((long)&local_138 + lVar5 + 4);
      fVar27 = *(float *)((long)&uStack_130 + lVar5);
      fVar28 = *(float *)((long)&uStack_130 + lVar5 + 4);
      lVar6 = lVar20 * 4;
      *(float *)((long)&local_138 + lVar6) = *(float *)((long)&local_138 + lVar5) * fVar26;
      *(float *)((long)&local_138 + lVar6 + 4) = fVar15 * fVar26;
      *(float *)((long)&uStack_130 + lVar6) = fVar27 * fVar26;
      *(float *)((long)&uStack_130 + lVar6 + 4) = fVar28 * fVar26;
      lVar20 = lVar20 + 4;
    } while (lVar20 != 0x10);
    *(undefined8 *)(l_child->m_v + 0xc) = local_c8;
    *(undefined8 *)(l_child->m_v + 0xe) = uStack_c0;
    *(undefined8 *)(l_child->m_v + 8) = local_d8;
    *(undefined8 *)(l_child->m_v + 10) = uStack_d0;
    *(undefined8 *)(l_child->m_v + 4) = local_e8;
    *(undefined8 *)(l_child->m_v + 6) = uStack_e0;
    *(undefined8 *)l_child->m_v = local_f8;
    *(undefined8 *)(l_child->m_v + 2) = uStack_f0;
    *(undefined8 *)(r_child->m_v + 0xc) = local_108;
    *(undefined8 *)(r_child->m_v + 0xe) = uStack_100;
    *(undefined8 *)(r_child->m_v + 8) = local_118;
    *(undefined8 *)(r_child->m_v + 10) = uStack_110;
    *(undefined8 *)(r_child->m_v + 4) = local_128;
    *(undefined8 *)(r_child->m_v + 6) = uStack_120;
    *(undefined8 *)r_child->m_v = local_138;
    *(undefined8 *)(r_child->m_v + 2) = uStack_130;
    fVar26 = *l_var + *r_var;
    if (fVar26 < 1e-05) {
      return true;
    }
    if ((fVar25 - fVar26) / fVar26 < 0.00125) {
      return true;
    }
    iVar18 = iVar18 + 1;
    fVar25 = fVar26;
    if (iVar18 == 6) {
      return true;
    }
  } while( true );
LAB_00243075:
  __function = 
  "const T &basisu::vector<std::pair<basisu::vec<16, float>, unsigned long>>::operator[](size_t) const [T = std::pair<basisu::vec<16, float>, unsigned long>]"
  ;
  goto LAB_002430a1;
LAB_0024308c:
  __function = "const T &basisu::vector<unsigned int>::operator[](size_t) const [T = unsigned int]";
LAB_002430a1:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x177,__function);
}

Assistant:

bool refine_split(const tsvq_node &node,
			TrainingVectorType &l_child, uint64_t &l_weight, float &l_var, basisu::vector<uint32_t> &l_children,
			TrainingVectorType &r_child, uint64_t &r_weight, float &r_var, basisu::vector<uint32_t> &r_children) const
		{
			l_children.reserve(node.m_training_vecs.size());
			r_children.reserve(node.m_training_vecs.size());

			float prev_total_variance = 1e+10f;

			// Refine left/right children locations using k-means iterations
			const uint32_t cMaxIters = 6;
			for (uint32_t iter = 0; iter < cMaxIters; iter++)
			{
				l_children.resize(0); 
				r_children.resize(0); 

				TrainingVectorType new_l_child(cZero), new_r_child(cZero);

				double l_ttsum = 0.0f, r_ttsum = 0.0f;

				l_weight = 0;
				r_weight = 0;

				for (uint32_t i = 0; i < node.m_training_vecs.size(); i++)
				{
					const TrainingVectorType &v = m_training_vecs[node.m_training_vecs[i]].first;
					const uint64_t weight = m_training_vecs[node.m_training_vecs[i]].second;

					double left_dist2 = l_child.squared_distance_d(v), right_dist2 = r_child.squared_distance_d(v);

					if (left_dist2 >= right_dist2)
					{
						new_r_child += (v * static_cast<float>(weight));
						r_weight += weight;

						r_ttsum += weight * v.dot(v);
						r_children.push_back(node.m_training_vecs[i]);
					}
					else
					{
						new_l_child += (v * static_cast<float>(weight));
						l_weight += weight;

						l_ttsum += weight * v.dot(v);
						l_children.push_back(node.m_training_vecs[i]);
					}
				}

				// Node is unsplittable using the above algorithm - try something else to split it up.
				if ((!l_weight) || (!r_weight))
				{
					l_children.resize(0);
					new_l_child.set(0.0f);
					l_ttsum = 0.0f;
					l_weight = 0;

					r_children.resize(0);
					new_r_child.set(0.0f);
					r_ttsum = 0.0f;
					r_weight = 0;

					TrainingVectorType firstVec;
					for (uint32_t i = 0; i < node.m_training_vecs.size(); i++)
					{
						const TrainingVectorType& v = m_training_vecs[node.m_training_vecs[i]].first;
						const uint64_t weight = m_training_vecs[node.m_training_vecs[i]].second;
					
						if ((!i) || (v == firstVec))
						{
							firstVec = v;

							new_r_child += (v * static_cast<float>(weight));
							r_weight += weight;

							r_ttsum += weight * v.dot(v);
							r_children.push_back(node.m_training_vecs[i]);
						}
						else
						{
							new_l_child += (v * static_cast<float>(weight));
							l_weight += weight;

							l_ttsum += weight * v.dot(v);
							l_children.push_back(node.m_training_vecs[i]);
						}
					}

					if ((!l_weight) || (!r_weight))
						return false;
				}

				l_var = static_cast<float>(l_ttsum - (new_l_child.dot(new_l_child) / l_weight));
				r_var = static_cast<float>(r_ttsum - (new_r_child.dot(new_r_child) / r_weight));

				new_l_child *= (1.0f / l_weight);
				new_r_child *= (1.0f / r_weight);

				l_child = new_l_child;
				r_child = new_r_child;

				float total_var = l_var + r_var;
				const float cGiveupVariance = .00001f;
				if (total_var < cGiveupVariance)
					break;

				// Check to see if the variance has settled
				const float cVarianceDeltaThresh = .00125f;
				if (((prev_total_variance - total_var) / total_var) < cVarianceDeltaThresh)
					break;

				prev_total_variance = total_var;
			}

			return true;
		}